

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O1

int Rwr_NodeRewrite(Rwr_Man_t *p,Cut_Man_t *pManCut,Abc_Obj_t *pNode,int fUpdateLevel,int fUseZeros,
                   int fPlaceEnable)

{
  ushort uVar1;
  char *pcVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void **ppvVar7;
  ulong uVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Dec_Graph_t *pDVar18;
  uint uVar19;
  Rwr_Man_t *pRVar20;
  uint uVar21;
  uint *puVar22;
  timespec ts;
  timespec local_98;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  uint *local_78;
  Abc_Obj_t *local_70;
  int local_64;
  Dec_Graph_t *local_60;
  Rwr_Man_t *local_58;
  int local_4c;
  long local_48;
  ulong local_40;
  long local_38;
  
  p->nNodesConsidered = p->nNodesConsidered + 1;
  local_4c = fUseZeros;
  if (fUpdateLevel == 0) {
    local_64 = 1000000000;
  }
  else {
    local_64 = Abc_ObjRequiredLevel(pNode);
  }
  local_58 = p;
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  pvVar6 = Abc_NodeGetCutsRecursive(pManCut,pNode,0,0);
  if (pvVar6 == (void *)0x0) {
    __assert_fail("pCut != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                  ,0x51,"int Rwr_NodeRewrite(Rwr_Man_t *, Cut_Man_t *, Abc_Obj_t *, int, int, int)")
    ;
  }
  iVar4 = clock_gettime(3,&local_98);
  pRVar20 = local_58;
  if (iVar4 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
  }
  local_58->timeCut = local_58->timeCut + lVar16 + lVar15;
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    local_48 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_48 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  puVar22 = *(uint **)((long)pvVar6 + 0x10);
  local_40 = 0;
  if (puVar22 == (uint *)0x0) {
    iVar4 = -1;
    uVar13 = 0;
  }
  else {
    local_80 = -1;
    local_88 = -1;
    local_70 = pNode;
    do {
      if (0x3fffffff < *puVar22) {
        uVar1 = *(ushort *)((long)puVar22 + (ulong)(*puVar22 >> 0x16 & 0x3c) + 0x18);
        pcVar2 = pRVar20->pPerms4[pRVar20->pPerms[uVar1]];
        uVar19 = (uint)pRVar20->pPhases[uVar1];
        pVVar10 = pRVar20->vFaninsCur;
        pVVar10->nSize = 0;
        uVar11 = *puVar22;
        uVar21 = uVar11 >> 0x1c;
        local_78 = puVar22;
        if (pVVar10->nCap < (int)uVar21) {
          local_7c = uVar19;
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)(uVar21 * 8));
          }
          else {
            ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)(uVar21 * 8));
          }
          pVVar10->pArray = ppvVar7;
          pVVar10->nCap = uVar21;
          uVar19 = local_7c;
        }
        puVar22 = local_78;
        if (0xfffffff < uVar11) {
          uVar13 = 0;
          do {
            pVVar10->pArray[uVar13] = (void *)0x0;
            uVar13 = uVar13 + 1;
          } while (uVar21 != uVar13);
        }
        pVVar10->nSize = uVar21;
        uVar11 = *local_78 >> 0x1c;
        uVar13 = (ulong)uVar11;
        uVar8 = 0;
        if (0xfffffff < *local_78) {
          uVar8 = 0;
          do {
            uVar11 = (uint)uVar13;
            uVar21 = local_78[(long)pcVar2[uVar8] + 6];
            if (((long)(int)uVar21 < 0) ||
               (pVVar10 = pNode->pNtk->vObjs, pVVar10->nSize <= (int)uVar21)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar6 = pVVar10->pArray[(int)uVar21];
            if (pvVar6 == (void *)0x0) break;
            if ((long)pRVar20->vFaninsCur->nSize <= (long)uVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            pRVar20->vFaninsCur->pArray[uVar8] =
                 (void *)((ulong)pvVar6 ^ (ulong)((uVar19 >> ((uint)uVar8 & 0x1f) & 1) != 0));
            uVar8 = uVar8 + 1;
            uVar11 = *local_78 >> 0x1c;
            uVar13 = (ulong)uVar11;
          } while (uVar8 < uVar13);
        }
        if ((uint)uVar8 == uVar11) {
          pRVar20->nCutsGood = pRVar20->nCutsGood + 1;
          lVar15 = (long)pRVar20->vFaninsCur->nSize;
          if (0 < lVar15) {
            lVar16 = 0;
            uVar11 = 0;
            do {
              uVar11 = uVar11 + (*(int *)(((ulong)pRVar20->vFaninsCur->pArray[lVar16] &
                                          0xfffffffffffffffe) + 0x2c) == 1);
              lVar16 = lVar16 + 1;
            } while (lVar15 != lVar16);
            if (2 < uVar11) goto LAB_004be074;
          }
          local_7c = uVar19;
          iVar4 = clock_gettime(3,&local_98);
          if (iVar4 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_98.tv_sec * -1000000;
          }
          lVar16 = (long)pRVar20->vFaninsCur->nSize;
          if (0 < lVar16) {
            ppvVar7 = pRVar20->vFaninsCur->pArray;
            lVar17 = 0;
            do {
              piVar9 = (int *)(((ulong)ppvVar7[lVar17] & 0xfffffffffffffffe) + 0x2c);
              *piVar9 = *piVar9 + 1;
              lVar17 = lVar17 + 1;
            } while (lVar16 != lVar17);
          }
          pAVar3 = pNode->pNtk;
          if ((pAVar3->vTravIds).pArray == (int *)0x0) {
            iVar4 = pAVar3->vObjs->nSize;
            uVar13 = (long)iVar4 + 500;
            iVar5 = (int)uVar13;
            if ((pAVar3->vTravIds).nCap < iVar5) {
              piVar9 = (int *)malloc(uVar13 * 4);
              (pAVar3->vTravIds).pArray = piVar9;
              if (piVar9 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pAVar3->vTravIds).nCap = iVar5;
            }
            if (-500 < iVar4) {
              memset((pAVar3->vTravIds).pArray,0,(uVar13 & 0xffffffff) << 2);
            }
            (pAVar3->vTravIds).nSize = iVar5;
            puVar22 = local_78;
            pNode = local_70;
          }
          iVar4 = pAVar3->nTravIds;
          pAVar3->nTravIds = iVar4 + 1;
          if (0x3ffffffe < iVar4) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          iVar4 = Abc_NodeMffcLabelAig(pNode);
          lVar16 = (long)pRVar20->vFaninsCur->nSize;
          if (0 < lVar16) {
            ppvVar7 = pRVar20->vFaninsCur->pArray;
            lVar17 = 0;
            do {
              piVar9 = (int *)(((ulong)ppvVar7[lVar17] & 0xfffffffffffffffe) + 0x2c);
              *piVar9 = *piVar9 + -1;
              lVar17 = lVar17 + 1;
            } while (lVar16 != lVar17);
          }
          iVar5 = clock_gettime(3,&local_98);
          if (iVar5 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          pRVar20->timeMffc = pRVar20->timeMffc + lVar16 + lVar15;
          iVar5 = clock_gettime(3,&local_98);
          if (iVar5 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_98.tv_sec * -1000000;
          }
          if (pRVar20->vClasses->nSize <=
              (int)(uint)pRVar20->pMap
                         [(ushort)puVar22[(ulong)(*(byte *)((long)puVar22 + 3) & 0xf) + 6]]) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          pVVar10 = pRVar20->vFaninsCur;
          pvVar6 = pRVar20->vClasses->pArray
                   [pRVar20->pMap[(ushort)puVar22[(ulong)(*(byte *)((long)puVar22 + 3) & 0xf) + 6]]]
          ;
          iVar5 = *(int *)((long)pvVar6 + 4);
          pRVar20->nSubgraphs = pRVar20->nSubgraphs + iVar5;
          local_38 = lVar15;
          if (iVar5 < 1) {
            local_84 = -1;
            local_60 = (Dec_Graph_t *)0x0;
          }
          else {
            local_84 = -1;
            lVar15 = 0;
            local_60 = (Dec_Graph_t *)0x0;
            do {
              lVar16 = *(long *)(*(long *)((long)pvVar6 + 8) + lVar15 * 8);
              pDVar18 = *(Dec_Graph_t **)(lVar16 + 0x28);
              if (0 < pVVar10->nSize) {
                lVar17 = 1;
                lVar14 = 0;
                do {
                  *(void **)(&pDVar18->pNodes->eEdge0 + lVar17 * 2) = pVVar10->pArray[lVar14];
                  lVar14 = lVar14 + 1;
                  lVar17 = lVar17 + 3;
                } while (lVar14 < pVVar10->nSize);
              }
              iVar5 = Dec_GraphToNetworkCount(local_70,pDVar18,iVar4,local_64);
              if (iVar5 != -1) {
                iVar12 = iVar4 - iVar5;
                if (iVar4 < iVar5) {
                  __assert_fail("nNodesSaved >= nNodesAdded",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                                ,0x119,
                                "Dec_Graph_t *Rwr_CutEvaluate(Rwr_Man_t *, Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *, int, int, int *, int)"
                               );
                }
                if (local_84 < iVar12) {
                  local_60 = pDVar18;
                  if (iVar12 < 1) {
                    local_84 = 0;
                  }
                  else {
                    *(short *)(lVar16 + 8) = *(short *)(lVar16 + 8) + 1;
                    *(short *)(lVar16 + 10) = *(short *)(lVar16 + 10) + (short)iVar12;
                    *(short *)(lVar16 + 0xc) = *(short *)(lVar16 + 0xc) + (short)iVar5;
                    local_84 = iVar12;
                  }
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)pvVar6 + 4));
          }
          if (local_84 != -1) {
            local_88 = local_84;
          }
          pDVar18 = (Dec_Graph_t *)0x0;
          if (local_84 != -1) {
            pDVar18 = local_60;
          }
          iVar4 = clock_gettime(3,&local_98);
          pRVar20 = local_58;
          if (iVar4 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          local_58->timeEval = local_58->timeEval + lVar15 + local_38;
          puVar22 = local_78;
          pNode = local_70;
          if ((pDVar18 != (Dec_Graph_t *)0x0) && (local_80 < local_88)) {
            local_58->pGraph = pDVar18;
            local_58->fCompl = local_7c >> 4 & 1;
            local_40 = (ulong)(ushort)local_78[(ulong)(*(byte *)((long)local_78 + 3) & 0xf) + 6];
            local_58->vFanins->nSize = 0;
            pVVar10 = local_58->vFaninsCur;
            if (pVVar10->nSize < 1) {
              local_80 = local_88;
            }
            else {
              lVar15 = 0;
              do {
                pvVar6 = pVVar10->pArray[lVar15];
                pVVar10 = pRVar20->vFanins;
                uVar11 = pVVar10->nCap;
                if (pVVar10->nSize == uVar11) {
                  if ((int)uVar11 < 0x10) {
                    if (pVVar10->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                    }
                    pVVar10->pArray = ppvVar7;
                    iVar4 = 0x10;
                  }
                  else {
                    iVar4 = uVar11 * 2;
                    if (iVar4 <= (int)uVar11) goto LAB_004be46b;
                    if (pVVar10->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar11 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar11 << 4);
                    }
                    pVVar10->pArray = ppvVar7;
                  }
                  pVVar10->nCap = iVar4;
                }
LAB_004be46b:
                iVar4 = pVVar10->nSize;
                pVVar10->nSize = iVar4 + 1;
                pVVar10->pArray[iVar4] = pvVar6;
                lVar15 = lVar15 + 1;
                pVVar10 = pRVar20->vFaninsCur;
              } while (lVar15 < pVVar10->nSize);
              local_80 = local_88;
              puVar22 = local_78;
              pNode = local_70;
            }
          }
        }
        else {
          pRVar20->nCutsBad = pRVar20->nCutsBad + 1;
        }
      }
LAB_004be074:
      puVar22 = *(uint **)(puVar22 + 4);
    } while (puVar22 != (uint *)0x0);
    uVar13 = local_40 & 0xffffffff;
    iVar4 = local_80;
  }
  iVar5 = clock_gettime(3,&local_98);
  if (iVar5 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
  }
  pRVar20->timeRes = pRVar20->timeRes + lVar15 + local_48;
  if (iVar4 == -1) {
    iVar4 = -1;
  }
  else {
    pVVar10 = pRVar20->vFanins;
    if (0 < pVVar10->nSize) {
      lVar15 = 1;
      lVar16 = 0;
      do {
        *(void **)(*(long *)((long)pRVar20->pGraph + 0x10) + lVar15 * 8) = pVVar10->pArray[lVar16];
        lVar16 = lVar16 + 1;
        pVVar10 = pRVar20->vFanins;
        lVar15 = lVar15 + 3;
      } while (lVar16 < pVVar10->nSize);
    }
    pRVar20->nScores[pRVar20->pMap[uVar13]] = pRVar20->nScores[pRVar20->pMap[uVar13]] + 1;
    pRVar20->nNodesGained = pRVar20->nNodesGained + iVar4;
    if ((local_4c != 0) || (0 < iVar4)) {
      pRVar20->nNodesRewritten = pRVar20->nNodesRewritten + 1;
    }
  }
  return iVar4;
}

Assistant:

int Rwr_NodeRewrite( Rwr_Man_t * p, Cut_Man_t * pManCut, Abc_Obj_t * pNode, int fUpdateLevel, int fUseZeros, int fPlaceEnable )
{
    int fVeryVerbose = 0;
    Dec_Graph_t * pGraph;
    Cut_Cut_t * pCut;//, * pTemp;
    Abc_Obj_t * pFanin;
    unsigned uPhase;
    unsigned uTruthBest = 0; // Suppress "might be used uninitialized"
    unsigned uTruth;
    char * pPerm;
    int Required, nNodesSaved;
    int nNodesSaveCur = -1; // Suppress "might be used uninitialized"
    int i, GainCur = -1, GainBest = -1;
    abctime clk, clk2;//, Counter;

    p->nNodesConsidered++;
    // get the required times
    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the node's cuts
clk = Abc_Clock();
    pCut = (Cut_Cut_t *)Abc_NodeGetCutsRecursive( pManCut, pNode, 0, 0 );
    assert( pCut != NULL );
p->timeCut += Abc_Clock() - clk;

//printf( " %d", Rwr_CutCountNumNodes(pNode, pCut) );
/*
    Counter = 0;
    for ( pTemp = pCut->pNext; pTemp; pTemp = pTemp->pNext )
        Counter++;
    printf( "%d ", Counter );
*/
    // go through the cuts
clk = Abc_Clock();
    for ( pCut = pCut->pNext; pCut; pCut = pCut->pNext )
    {
        // consider only 4-input cuts
        if ( pCut->nLeaves < 4 )
            continue;
//            Cut_CutPrint( pCut, 0 ), printf( "\n" );

        // get the fanin permutation
        uTruth = 0xFFFF & *Cut_CutReadTruth(pCut);
        pPerm = p->pPerms4[ (int)p->pPerms[uTruth] ];
        uPhase = p->pPhases[uTruth];
        // collect fanins with the corresponding permutation/phase
        Vec_PtrClear( p->vFaninsCur );
        Vec_PtrFill( p->vFaninsCur, (int)pCut->nLeaves, 0 );
        for ( i = 0; i < (int)pCut->nLeaves; i++ )
        {
            pFanin = Abc_NtkObj( pNode->pNtk, pCut->pLeaves[(int)pPerm[i]] );
            if ( pFanin == NULL )
                break;
            pFanin = Abc_ObjNotCond(pFanin, ((uPhase & (1<<i)) > 0) );
            Vec_PtrWriteEntry( p->vFaninsCur, i, pFanin );
        }
        if ( i != (int)pCut->nLeaves )
        {
            p->nCutsBad++;
            continue;
        }
        p->nCutsGood++;

        {
            int Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                if ( Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) == 1 )
                    Counter++;
            if ( Counter > 2 )
                continue;
        }

clk2 = Abc_Clock();
/*
        printf( "Considering: (" );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            printf( "%d ", Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) );
        printf( ")\n" );
*/
        // mark the fanin boundary 
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize++;

        // label MFFC with current ID
        Abc_NtkIncrementTravId( pNode->pNtk );
        nNodesSaved = Abc_NodeMffcLabelAig( pNode );
        // unmark the fanin boundary
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize--;
p->timeMffc += Abc_Clock() - clk2;

        // evaluate the cut
clk2 = Abc_Clock();
        pGraph = Rwr_CutEvaluate( p, pNode, pCut, p->vFaninsCur, nNodesSaved, Required, &GainCur, fPlaceEnable );
p->timeEval += Abc_Clock() - clk2;

        // check if the cut is better than the current best one
        if ( pGraph != NULL && GainBest < GainCur )
        {
            // save this form
            nNodesSaveCur = nNodesSaved;
            GainBest  = GainCur;
            p->pGraph  = pGraph;
            p->fCompl = ((uPhase & (1<<4)) > 0);
            uTruthBest = 0xFFFF & *Cut_CutReadTruth(pCut);
            // collect fanins in the
            Vec_PtrClear( p->vFanins );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                Vec_PtrPush( p->vFanins, pFanin );
        }
    }
p->timeRes += Abc_Clock() - clk;

    if ( GainBest == -1 )
        return -1;
/*
    if ( GainBest > 0 )
    {
        printf( "Class %d  ", p->pMap[uTruthBest] );
        printf( "Gain = %d. Node %d : ", GainBest, pNode->Id );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
            printf( "%d ", Abc_ObjRegular(pFanin)->Id );
        Dec_GraphPrint( stdout, p->pGraph, NULL, NULL );
        printf( "\n" );
    }
*/

//    printf( "%d", nNodesSaveCur - GainBest );
/*
    if ( GainBest > 0 )
    {
        if ( Rwr_CutIsBoolean( pNode, p->vFanins ) )
            printf( "b" );
        else
        {
            printf( "Node %d : ", pNode->Id );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
                printf( "%d ", Abc_ObjRegular(pFanin)->Id );
            printf( "a" );
        }
    }
*/
/*
    if ( GainBest > 0 )
        if ( p->fCompl )
            printf( "c" );
        else
            printf( "." );
*/

    // copy the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        Dec_GraphNode((Dec_Graph_t *)p->pGraph, i)->pFunc = pFanin;
/*
    printf( "(" );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        printf( " %d", Abc_ObjRegular(pFanin)->vFanouts.nSize - 1 );
    printf( " )  " );
*/
//    printf( "%d ", Rwr_NodeGetDepth_rec( pNode, p->vFanins ) );

    p->nScores[p->pMap[uTruthBest]]++;
    p->nNodesGained += GainBest;
    if ( fUseZeros || GainBest > 0 )
    {
        p->nNodesRewritten++;
    }

    // report the progress
    if ( fVeryVerbose && GainBest > 0 )
    {
        printf( "Node %6s :   ", Abc_ObjName(pNode) );
        printf( "Fanins = %d. ", p->vFanins->nSize );
        printf( "Save = %d.  ", nNodesSaveCur );
        printf( "Add = %d.  ",  nNodesSaveCur-GainBest );
        printf( "GAIN = %d.  ", GainBest );
        printf( "Cone = %d.  ", p->pGraph? Dec_GraphNodeNum((Dec_Graph_t *)p->pGraph) : 0 );
        printf( "Class = %d.  ", p->pMap[uTruthBest] );
        printf( "\n" );
    }
    return GainBest;
}